

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void PredictorAdd10_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  longlong lVar3;
  longlong lVar4;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  __m128i avg_3;
  __m128i avgLTL_3;
  __m128i avg_2;
  __m128i avgLTL_2;
  __m128i avg_1;
  __m128i avgLTL_1;
  __m128i avg;
  __m128i avgLTL;
  __m128i avgTTR;
  __m128i TR;
  __m128i T;
  __m128i TL;
  __m128i src;
  __m128i L;
  int i;
  longlong local_258 [2];
  longlong local_248 [2];
  longlong local_238;
  longlong lStack_230;
  longlong local_228 [2];
  longlong local_218;
  longlong lStack_210;
  longlong local_208 [2];
  longlong local_1f8;
  longlong lStack_1f0;
  longlong local_1e8 [2];
  __m128i local_1d8;
  longlong local_1c8;
  longlong lStack_1c0;
  longlong local_1b8;
  longlong lStack_1b0;
  __m128i local_1a8;
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  int local_16c;
  long local_168;
  int local_15c;
  long local_158;
  long local_150;
  undefined1 local_148 [16];
  uint local_12c;
  ulong local_128;
  longlong lStack_120;
  ulong local_118;
  longlong lStack_110;
  longlong local_108;
  longlong lStack_100;
  longlong local_f8;
  longlong lStack_f0;
  longlong local_e8;
  longlong lStack_e0;
  longlong local_d8;
  longlong lStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  longlong *local_a8;
  longlong *local_a0;
  __m128i *local_98;
  undefined1 (*local_90) [16];
  undefined8 local_88;
  undefined8 uStack_80;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_12c = *(uint *)(in_RCX + -4);
  local_148._4_4_ = 0;
  local_148._0_4_ = local_12c;
  local_188 = local_148._0_8_;
  uStack_180 = 0;
  local_168 = in_RCX;
  local_15c = in_EDX;
  local_158 = in_RSI;
  local_150 = in_RDI;
  local_148 = ZEXT416(local_12c);
  for (local_16c = 0; local_16c + 4 <= local_15c; local_16c = local_16c + 4) {
    local_90 = (undefined1 (*) [16])(local_150 + (long)local_16c * 4);
    local_198 = *local_90;
    local_98 = (__m128i *)(local_158 + (long)(local_16c + -1) * 4);
    local_1a8 = *local_98;
    local_a0 = (longlong *)(local_158 + (long)local_16c * 4);
    local_1b8 = *local_a0;
    lStack_1b0 = local_a0[1];
    local_a8 = (longlong *)(local_158 + (long)(local_16c + 1) * 4);
    local_1c8 = *local_a8;
    lStack_1c0 = local_a8[1];
    Average2_m128i((__m128i *)&local_1b8,(__m128i *)&local_1c8,&local_1d8);
    Average2_m128i((__m128i *)&local_188,&local_1a8,&local_1e8);
    Average2_m128i(&local_1d8,&local_1e8,(__m128i *)&local_1f8);
    local_18 = local_1f8;
    lVar3 = local_18;
    uStack_10 = lStack_1f0;
    lVar4 = uStack_10;
    local_28 = local_198._0_8_;
    uVar1 = local_28;
    uStack_20 = local_198._8_8_;
    uVar2 = uStack_20;
    local_18._0_1_ = (char)local_1f8;
    local_18._1_1_ = (char)((ulong)local_1f8 >> 8);
    local_18._2_1_ = (char)((ulong)local_1f8 >> 0x10);
    local_18._3_1_ = (char)((ulong)local_1f8 >> 0x18);
    local_18._4_1_ = (char)((ulong)local_1f8 >> 0x20);
    local_18._5_1_ = (char)((ulong)local_1f8 >> 0x28);
    local_18._6_1_ = (char)((ulong)local_1f8 >> 0x30);
    local_18._7_1_ = (char)((ulong)local_1f8 >> 0x38);
    uStack_10._0_1_ = (char)lStack_1f0;
    uStack_10._1_1_ = (char)((ulong)lStack_1f0 >> 8);
    uStack_10._2_1_ = (char)((ulong)lStack_1f0 >> 0x10);
    uStack_10._3_1_ = (char)((ulong)lStack_1f0 >> 0x18);
    uStack_10._4_1_ = (char)((ulong)lStack_1f0 >> 0x20);
    uStack_10._5_1_ = (char)((ulong)lStack_1f0 >> 0x28);
    uStack_10._6_1_ = (char)((ulong)lStack_1f0 >> 0x30);
    uStack_10._7_1_ = (char)((ulong)lStack_1f0 >> 0x38);
    local_28._0_1_ = local_198[0];
    local_28._1_1_ = local_198[1];
    local_28._2_1_ = local_198[2];
    local_28._3_1_ = local_198[3];
    local_28._4_1_ = local_198[4];
    local_28._5_1_ = local_198[5];
    local_28._6_1_ = local_198[6];
    local_28._7_1_ = local_198[7];
    uStack_20._0_1_ = local_198[8];
    uStack_20._1_1_ = local_198[9];
    uStack_20._2_1_ = local_198[10];
    uStack_20._3_1_ = local_198[0xb];
    uStack_20._4_1_ = local_198[0xc];
    uStack_20._5_1_ = local_198[0xd];
    uStack_20._6_1_ = local_198[0xe];
    uStack_20._7_1_ = local_198[0xf];
    local_188._0_2_ = CONCAT11(local_18._1_1_ + local_28._1_1_,(char)local_18 + (char)local_28);
    local_188._0_3_ = CONCAT12(local_18._2_1_ + local_28._2_1_,(undefined2)local_188);
    local_188._0_4_ = CONCAT13(local_18._3_1_ + local_28._3_1_,(undefined3)local_188);
    local_188._0_5_ = CONCAT14(local_18._4_1_ + local_28._4_1_,(undefined4)local_188);
    local_188._0_6_ = CONCAT15(local_18._5_1_ + local_28._5_1_,(undefined5)local_188);
    local_188._0_7_ = CONCAT16(local_18._6_1_ + local_28._6_1_,(undefined6)local_188);
    local_188 = CONCAT17(local_18._7_1_ + local_28._7_1_,(undefined7)local_188);
    uStack_180._0_2_ = CONCAT11(uStack_10._1_1_ + uStack_20._1_1_,(char)uStack_10 + (char)uStack_20)
    ;
    uStack_180._0_3_ = CONCAT12(uStack_10._2_1_ + uStack_20._2_1_,(undefined2)uStack_180);
    uStack_180._0_4_ = CONCAT13(uStack_10._3_1_ + uStack_20._3_1_,(undefined3)uStack_180);
    uStack_180._0_5_ = CONCAT14(uStack_10._4_1_ + uStack_20._4_1_,(undefined4)uStack_180);
    uStack_180._0_6_ = CONCAT15(uStack_10._5_1_ + uStack_20._5_1_,(undefined5)uStack_180);
    uStack_180._0_7_ = CONCAT16(uStack_10._6_1_ + uStack_20._6_1_,(undefined6)uStack_180);
    uStack_180 = CONCAT17(uStack_10._7_1_ + uStack_20._7_1_,(undefined7)uStack_180);
    local_b8 = local_188;
    lStack_b0 = uStack_180;
    local_c8 = local_188;
    lStack_c0 = uStack_180;
    *(undefined4 *)(local_168 + (long)local_16c * 4) = (undefined4)local_188;
    local_1d8 = (__m128i)((undefined1  [16])local_1d8 >> 0x20);
    local_1a8 = (__m128i)((undefined1  [16])local_1a8 >> 0x20);
    local_198 = local_198 >> 0x20;
    local_28 = uVar1;
    uStack_20 = uVar2;
    local_18 = lVar3;
    uStack_10 = lVar4;
    Average2_m128i((__m128i *)&local_188,&local_1a8,&local_208);
    Average2_m128i(&local_1d8,&local_208,(__m128i *)&local_218);
    local_38 = local_218;
    lVar3 = local_38;
    uStack_30 = lStack_210;
    lVar4 = uStack_30;
    local_48 = local_198._0_8_;
    uVar1 = local_48;
    uStack_40 = local_198._8_8_;
    uVar2 = uStack_40;
    local_38._0_1_ = (char)local_218;
    local_38._1_1_ = (char)((ulong)local_218 >> 8);
    local_38._2_1_ = (char)((ulong)local_218 >> 0x10);
    local_38._3_1_ = (char)((ulong)local_218 >> 0x18);
    local_38._4_1_ = (char)((ulong)local_218 >> 0x20);
    local_38._5_1_ = (char)((ulong)local_218 >> 0x28);
    local_38._6_1_ = (char)((ulong)local_218 >> 0x30);
    local_38._7_1_ = (char)((ulong)local_218 >> 0x38);
    uStack_30._0_1_ = (char)lStack_210;
    uStack_30._1_1_ = (char)((ulong)lStack_210 >> 8);
    uStack_30._2_1_ = (char)((ulong)lStack_210 >> 0x10);
    uStack_30._3_1_ = (char)((ulong)lStack_210 >> 0x18);
    uStack_30._4_1_ = (char)((ulong)lStack_210 >> 0x20);
    uStack_30._5_1_ = (char)((ulong)lStack_210 >> 0x28);
    uStack_30._6_1_ = (char)((ulong)lStack_210 >> 0x30);
    uStack_30._7_1_ = (char)((ulong)lStack_210 >> 0x38);
    local_48._0_1_ = local_198[0];
    local_48._1_1_ = local_198[1];
    local_48._2_1_ = local_198[2];
    local_48._3_1_ = local_198[3];
    local_48._4_1_ = local_198[4];
    local_48._5_1_ = local_198[5];
    local_48._6_1_ = local_198[6];
    local_48._7_1_ = local_198[7];
    uStack_40._0_1_ = local_198[8];
    uStack_40._1_1_ = local_198[9];
    uStack_40._2_1_ = local_198[10];
    uStack_40._3_1_ = local_198[0xb];
    uStack_40._4_1_ = local_198[0xc];
    uStack_40._5_1_ = local_198[0xd];
    uStack_40._6_1_ = local_198[0xe];
    uStack_40._7_1_ = local_198[0xf];
    local_188._0_2_ = CONCAT11(local_38._1_1_ + local_48._1_1_,(char)local_38 + (char)local_48);
    local_188._0_3_ = CONCAT12(local_38._2_1_ + local_48._2_1_,(undefined2)local_188);
    local_188._0_4_ = CONCAT13(local_38._3_1_ + local_48._3_1_,(undefined3)local_188);
    local_188._0_5_ = CONCAT14(local_38._4_1_ + local_48._4_1_,(undefined4)local_188);
    local_188._0_6_ = CONCAT15(local_38._5_1_ + local_48._5_1_,(undefined5)local_188);
    local_188._0_7_ = CONCAT16(local_38._6_1_ + local_48._6_1_,(undefined6)local_188);
    local_188 = CONCAT17(local_38._7_1_ + local_48._7_1_,(undefined7)local_188);
    uStack_180._0_2_ = CONCAT11(uStack_30._1_1_ + uStack_40._1_1_,(char)uStack_30 + (char)uStack_40)
    ;
    uStack_180._0_3_ = CONCAT12(uStack_30._2_1_ + uStack_40._2_1_,(undefined2)uStack_180);
    uStack_180._0_4_ = CONCAT13(uStack_30._3_1_ + uStack_40._3_1_,(undefined3)uStack_180);
    uStack_180._0_5_ = CONCAT14(uStack_30._4_1_ + uStack_40._4_1_,(undefined4)uStack_180);
    uStack_180._0_6_ = CONCAT15(uStack_30._5_1_ + uStack_40._5_1_,(undefined5)uStack_180);
    uStack_180._0_7_ = CONCAT16(uStack_30._6_1_ + uStack_40._6_1_,(undefined6)uStack_180);
    uStack_180 = CONCAT17(uStack_30._7_1_ + uStack_40._7_1_,(undefined7)uStack_180);
    local_d8 = local_188;
    lStack_d0 = uStack_180;
    local_e8 = local_188;
    lStack_e0 = uStack_180;
    *(undefined4 *)(local_168 + (long)(local_16c + 1) * 4) = (undefined4)local_188;
    local_1d8 = (__m128i)((undefined1  [16])local_1d8 >> 0x20);
    local_1a8 = (__m128i)((undefined1  [16])local_1a8 >> 0x20);
    local_198 = local_198 >> 0x20;
    local_48 = uVar1;
    uStack_40 = uVar2;
    local_38 = lVar3;
    uStack_30 = lVar4;
    Average2_m128i((__m128i *)&local_188,&local_1a8,&local_228);
    Average2_m128i(&local_1d8,&local_228,(__m128i *)&local_238);
    local_58 = local_238;
    lVar3 = local_58;
    uStack_50 = lStack_230;
    lVar4 = uStack_50;
    local_68 = local_198._0_8_;
    uVar1 = local_68;
    uStack_60 = local_198._8_8_;
    uVar2 = uStack_60;
    local_58._0_1_ = (char)local_238;
    local_58._1_1_ = (char)((ulong)local_238 >> 8);
    local_58._2_1_ = (char)((ulong)local_238 >> 0x10);
    local_58._3_1_ = (char)((ulong)local_238 >> 0x18);
    local_58._4_1_ = (char)((ulong)local_238 >> 0x20);
    local_58._5_1_ = (char)((ulong)local_238 >> 0x28);
    local_58._6_1_ = (char)((ulong)local_238 >> 0x30);
    local_58._7_1_ = (char)((ulong)local_238 >> 0x38);
    uStack_50._0_1_ = (char)lStack_230;
    uStack_50._1_1_ = (char)((ulong)lStack_230 >> 8);
    uStack_50._2_1_ = (char)((ulong)lStack_230 >> 0x10);
    uStack_50._3_1_ = (char)((ulong)lStack_230 >> 0x18);
    uStack_50._4_1_ = (char)((ulong)lStack_230 >> 0x20);
    uStack_50._5_1_ = (char)((ulong)lStack_230 >> 0x28);
    uStack_50._6_1_ = (char)((ulong)lStack_230 >> 0x30);
    uStack_50._7_1_ = (char)((ulong)lStack_230 >> 0x38);
    local_68._0_1_ = local_198[0];
    local_68._1_1_ = local_198[1];
    local_68._2_1_ = local_198[2];
    local_68._3_1_ = local_198[3];
    local_68._4_1_ = local_198[4];
    local_68._5_1_ = local_198[5];
    local_68._6_1_ = local_198[6];
    local_68._7_1_ = local_198[7];
    uStack_60._0_1_ = local_198[8];
    uStack_60._1_1_ = local_198[9];
    uStack_60._2_1_ = local_198[10];
    uStack_60._3_1_ = local_198[0xb];
    uStack_60._4_1_ = local_198[0xc];
    uStack_60._5_1_ = local_198[0xd];
    uStack_60._6_1_ = local_198[0xe];
    uStack_60._7_1_ = local_198[0xf];
    local_188._0_2_ = CONCAT11(local_58._1_1_ + local_68._1_1_,(char)local_58 + (char)local_68);
    local_188._0_3_ = CONCAT12(local_58._2_1_ + local_68._2_1_,(undefined2)local_188);
    local_188._0_4_ = CONCAT13(local_58._3_1_ + local_68._3_1_,(undefined3)local_188);
    local_188._0_5_ = CONCAT14(local_58._4_1_ + local_68._4_1_,(undefined4)local_188);
    local_188._0_6_ = CONCAT15(local_58._5_1_ + local_68._5_1_,(undefined5)local_188);
    local_188._0_7_ = CONCAT16(local_58._6_1_ + local_68._6_1_,(undefined6)local_188);
    local_188 = CONCAT17(local_58._7_1_ + local_68._7_1_,(undefined7)local_188);
    uStack_180._0_2_ = CONCAT11(uStack_50._1_1_ + uStack_60._1_1_,(char)uStack_50 + (char)uStack_60)
    ;
    uStack_180._0_3_ = CONCAT12(uStack_50._2_1_ + uStack_60._2_1_,(undefined2)uStack_180);
    uStack_180._0_4_ = CONCAT13(uStack_50._3_1_ + uStack_60._3_1_,(undefined3)uStack_180);
    uStack_180._0_5_ = CONCAT14(uStack_50._4_1_ + uStack_60._4_1_,(undefined4)uStack_180);
    uStack_180._0_6_ = CONCAT15(uStack_50._5_1_ + uStack_60._5_1_,(undefined5)uStack_180);
    uStack_180._0_7_ = CONCAT16(uStack_50._6_1_ + uStack_60._6_1_,(undefined6)uStack_180);
    uStack_180 = CONCAT17(uStack_50._7_1_ + uStack_60._7_1_,(undefined7)uStack_180);
    local_f8 = local_188;
    lStack_f0 = uStack_180;
    local_108 = local_188;
    lStack_100 = uStack_180;
    *(undefined4 *)(local_168 + (long)(local_16c + 2) * 4) = (undefined4)local_188;
    local_1d8 = (__m128i)((undefined1  [16])local_1d8 >> 0x20);
    local_1a8 = (__m128i)((undefined1  [16])local_1a8 >> 0x20);
    local_198 = local_198 >> 0x20;
    local_68 = uVar1;
    uStack_60 = uVar2;
    local_58 = lVar3;
    uStack_50 = lVar4;
    Average2_m128i((__m128i *)&local_188,&local_1a8,&local_248);
    Average2_m128i(&local_1d8,&local_248,&local_258);
    local_78 = (char)local_258[0];
    cStack_77 = (char)((ulong)local_258[0] >> 8);
    cStack_76 = (char)((ulong)local_258[0] >> 0x10);
    cStack_75 = (char)((ulong)local_258[0] >> 0x18);
    cStack_74 = (char)((ulong)local_258[0] >> 0x20);
    cStack_73 = (char)((ulong)local_258[0] >> 0x28);
    cStack_72 = (char)((ulong)local_258[0] >> 0x30);
    cStack_71 = (char)((ulong)local_258[0] >> 0x38);
    cStack_70 = (char)local_258[1];
    cStack_6f = (char)((ulong)local_258[1] >> 8);
    cStack_6e = (char)((ulong)local_258[1] >> 0x10);
    cStack_6d = (char)((ulong)local_258[1] >> 0x18);
    cStack_6c = (char)((ulong)local_258[1] >> 0x20);
    cStack_6b = (char)((ulong)local_258[1] >> 0x28);
    cStack_6a = (char)((ulong)local_258[1] >> 0x30);
    cStack_69 = (char)((ulong)local_258[1] >> 0x38);
    local_88._0_1_ = local_198[0];
    local_88._1_1_ = local_198[1];
    local_88._2_1_ = local_198[2];
    local_88._3_1_ = local_198[3];
    local_88._4_1_ = local_198[4];
    local_88._5_1_ = local_198[5];
    local_88._6_1_ = local_198[6];
    local_88._7_1_ = local_198[7];
    uStack_80._0_1_ = local_198[8];
    uStack_80._1_1_ = local_198[9];
    uStack_80._2_1_ = local_198[10];
    uStack_80._3_1_ = local_198[0xb];
    uStack_80._4_1_ = local_198[0xc];
    uStack_80._5_1_ = local_198[0xd];
    uStack_80._6_1_ = local_198[0xe];
    uStack_80._7_1_ = local_198[0xf];
    local_188._0_2_ = CONCAT11(cStack_77 + local_88._1_1_,local_78 + (char)local_88);
    local_188._0_3_ = CONCAT12(cStack_76 + local_88._2_1_,(undefined2)local_188);
    local_188._0_4_ = CONCAT13(cStack_75 + local_88._3_1_,(undefined3)local_188);
    local_188._0_5_ = CONCAT14(cStack_74 + local_88._4_1_,(undefined4)local_188);
    local_188._0_6_ = CONCAT15(cStack_73 + local_88._5_1_,(undefined5)local_188);
    local_188._0_7_ = CONCAT16(cStack_72 + local_88._6_1_,(undefined6)local_188);
    local_188 = CONCAT17(cStack_71 + local_88._7_1_,(undefined7)local_188);
    uStack_180._0_2_ = CONCAT11(cStack_6f + uStack_80._1_1_,cStack_70 + (char)uStack_80);
    uStack_180._0_3_ = CONCAT12(cStack_6e + uStack_80._2_1_,(undefined2)uStack_180);
    uStack_180._0_4_ = CONCAT13(cStack_6d + uStack_80._3_1_,(undefined3)uStack_180);
    uStack_180._0_5_ = CONCAT14(cStack_6c + uStack_80._4_1_,(undefined4)uStack_180);
    uStack_180._0_6_ = CONCAT15(cStack_6b + uStack_80._5_1_,(undefined5)uStack_180);
    uStack_180._0_7_ = CONCAT16(cStack_6a + uStack_80._6_1_,(undefined6)uStack_180);
    uStack_180 = CONCAT17(cStack_69 + uStack_80._7_1_,(undefined7)uStack_180);
    local_118 = local_188;
    lStack_110 = uStack_180;
    local_128 = local_188;
    lStack_120 = uStack_180;
    *(undefined4 *)(local_168 + (long)(local_16c + 3) * 4) = (undefined4)local_188;
    local_88 = local_198._0_8_;
    uStack_80 = local_198._8_8_;
  }
  if (local_16c != local_15c) {
    (*VP8LPredictorsAdd_C[10])
              ((uint32_t *)(local_150 + (long)local_16c * 4),
               (uint32_t *)(local_158 + (long)local_16c * 4),local_15c - local_16c,
               (uint32_t *)(local_168 + (long)local_16c * 4));
  }
  return;
}

Assistant:

static void PredictorAdd10_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  __m128i L = _mm_cvtsi32_si128((int)out[-1]);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TR = _mm_loadu_si128((const __m128i*)&upper[i + 1]);
    __m128i avgTTR;
    Average2_m128i(&T, &TR, &avgTTR);
    DO_PRED10(0);
    DO_PRED10_SHIFT;
    DO_PRED10(1);
    DO_PRED10_SHIFT;
    DO_PRED10(2);
    DO_PRED10_SHIFT;
    DO_PRED10(3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[10](in + i, upper + i, num_pixels - i, out + i);
  }
}